

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

void __thiscall
jessilib::parser_registration<test_parser>::parser_registration
          (parser_registration<test_parser> *this,string *in_format,bool in_force)

{
  undefined8 uVar1;
  id iVar2;
  shared_ptr<test_parser> local_40;
  shared_ptr<jessilib::parser> local_30;
  byte local_19;
  string *psStack_18;
  bool in_force_local;
  string *in_format_local;
  parser_registration<test_parser> *this_local;
  
  local_19 = in_force;
  psStack_18 = in_format;
  in_format_local = (string *)this;
  uVar1 = jessilib::impl::parser_manager::instance();
  std::make_shared<test_parser>();
  std::shared_ptr<jessilib::parser>::shared_ptr<test_parser,void>(&local_30,&local_40);
  iVar2 = jessilib::impl::parser_manager::register_parser(uVar1,&local_30,in_format,local_19 & 1);
  this->m_id = iVar2;
  std::shared_ptr<jessilib::parser>::~shared_ptr(&local_30);
  std::shared_ptr<test_parser>::~shared_ptr(&local_40);
  return;
}

Assistant:

parser_registration(std::string in_format, bool in_force = false) {
		m_id = impl::parser_manager::instance().register_parser(std::make_shared<T>(), in_format, in_force);
	}